

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O0

mz_bool mz_zip_writer_init_file
                  (mz_zip_archive *pZip,char *pFilename,mz_uint64 size_to_reserve_at_beginning)

{
  mz_bool mVar1;
  FILE *pFVar2;
  FILE *pFVar3;
  FILE *local_1048;
  size_t n;
  char buf [4096];
  mz_uint64 cur_ofs;
  FILE *pFile;
  mz_uint64 size_to_reserve_at_beginning_local;
  char *pFilename_local;
  mz_zip_archive *pZip_local;
  
  pZip->m_pWrite = mz_zip_file_write_func;
  pZip->m_pIO_opaque = pZip;
  mVar1 = mz_zip_writer_init(pZip,size_to_reserve_at_beginning);
  if (mVar1 == 0) {
    pZip_local._4_4_ = 0;
  }
  else {
    pFVar2 = fopen64(pFilename,"wb");
    if (pFVar2 == (FILE *)0x0) {
      mz_zip_writer_end(pZip);
      pZip_local._4_4_ = 0;
    }
    else {
      pZip->m_pState->m_pFile = (FILE *)pFVar2;
      if (size_to_reserve_at_beginning != 0) {
        buf[0xff8] = '\0';
        buf[0xff9] = '\0';
        buf[0xffa] = '\0';
        buf[0xffb] = '\0';
        buf[0xffc] = '\0';
        buf[0xffd] = '\0';
        buf[0xffe] = '\0';
        buf[0xfff] = '\0';
        memset(&n,0,0x1000);
        pFile = (FILE *)size_to_reserve_at_beginning;
        do {
          if (pFile < (FILE *)0x1001) {
            local_1048 = pFile;
          }
          else {
            local_1048 = (FILE *)0x1000;
          }
          pFVar3 = (FILE *)(*pZip->m_pWrite)(pZip->m_pIO_opaque,buf._4088_8_,&n,(size_t)local_1048);
          if (pFVar3 != local_1048) {
            mz_zip_writer_end(pZip);
            return 0;
          }
          buf._4088_8_ = local_1048 + buf._4088_8_;
          pFile = pFile + -(long)local_1048;
        } while (pFile != (FILE *)0x0);
      }
      pZip_local._4_4_ = 1;
    }
  }
  return pZip_local._4_4_;
}

Assistant:

mz_bool mz_zip_writer_init_file(mz_zip_archive *pZip, const char *pFilename, mz_uint64 size_to_reserve_at_beginning)
{
  MZ_FILE *pFile;
  pZip->m_pWrite = mz_zip_file_write_func;
  pZip->m_pIO_opaque = pZip;
  if (!mz_zip_writer_init(pZip, size_to_reserve_at_beginning))
    return MZ_FALSE;
  if (NULL == (pFile = MZ_FOPEN(pFilename, "wb")))
  {
    mz_zip_writer_end(pZip);
    return MZ_FALSE;
  }
  pZip->m_pState->m_pFile = pFile;
  if (size_to_reserve_at_beginning)
  {
    mz_uint64 cur_ofs = 0; char buf[4096]; MZ_CLEAR_OBJ(buf);
    do
    {
      size_t n = (size_t)MZ_MIN(sizeof(buf), size_to_reserve_at_beginning);
      if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_ofs, buf, n) != n)
      {
        mz_zip_writer_end(pZip);
        return MZ_FALSE;
      }
      cur_ofs += n; size_to_reserve_at_beginning -= n;
    } while (size_to_reserve_at_beginning);
  }
  return MZ_TRUE;
}